

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O1

int run_test_connection_fail(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int iVar3;
  uv_connect_cb cb;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_80;
  long lStack_78;
  uv_connect_cb p_Stack_70;
  undefined8 uStack_60;
  code *pcStack_58;
  long lStack_50;
  long lStack_48;
  sockaddr_in sStack_40;
  sockaddr_in sStack_30;
  uv_loop_t *puStack_20;
  long local_18;
  long local_10;
  
  puStack_20 = (uv_loop_t *)0x18094d;
  connection_fail(on_connect_with_close);
  local_10 = (long)timer_close_cb_calls;
  local_18 = 0;
  if (local_10 == 0) {
    local_10 = (long)timer_cb_calls;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001809ef;
    puStack_20 = (uv_loop_t *)0x180990;
    unaff_RBX = uv_default_loop();
    puStack_20 = (uv_loop_t *)0x1809a4;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_20 = (uv_loop_t *)0x1809ae;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_10 = 0;
    puStack_20 = (uv_loop_t *)0x1809bc;
    puVar2 = uv_default_loop();
    puStack_20 = (uv_loop_t *)0x1809c4;
    iVar1 = uv_loop_close(puVar2);
    local_18 = (long)iVar1;
    if (local_10 == local_18) {
      puStack_20 = (uv_loop_t *)0x1809da;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x1809ef;
    run_test_connection_fail_cold_1();
LAB_001809ef:
    puStack_20 = (uv_loop_t *)0x1809fc;
    run_test_connection_fail_cold_2();
  }
  cb = (uv_connect_cb)&local_10;
  puStack_20 = (uv_loop_t *)connection_fail;
  run_test_connection_fail_cold_3();
  plVar4 = &lStack_50;
  pcStack_58 = (code *)0x180a24;
  puStack_20 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0,&sStack_30);
  sStack_40._0_8_ = SEXT48(iVar1);
  lStack_50 = 0;
  if (sStack_40._0_8_ == 0) {
    pcStack_58 = (code *)0x180a58;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_40);
    lStack_50 = (long)iVar1;
    lStack_48 = 0;
    if (lStack_50 != 0) goto LAB_00180b42;
    pcStack_58 = (code *)0x180a7b;
    puVar2 = uv_default_loop();
    pcStack_58 = (code *)0x180a8a;
    iVar1 = uv_tcp_init(puVar2,&tcp);
    if (iVar1 != 0) goto LAB_00180b4f;
    pcStack_58 = (code *)0x180aa5;
    iVar1 = uv_tcp_bind(&tcp,(sockaddr *)&sStack_30,0);
    lStack_50 = (long)iVar1;
    lStack_48 = 0;
    if (lStack_50 != 0) goto LAB_00180b54;
    pcStack_58 = (code *)0x180ade;
    iVar1 = uv_tcp_connect(&req,&tcp,(sockaddr *)&sStack_40,cb);
    if (iVar1 != 0) goto LAB_00180b61;
    pcStack_58 = (code *)0x180ae7;
    puVar2 = uv_default_loop();
    pcStack_58 = (code *)0x180af1;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_50 = 1;
    lStack_48 = (long)connect_cb_calls;
    if (lStack_48 != 1) goto LAB_00180b66;
    lStack_50 = 1;
    lStack_48 = (long)close_cb_calls;
    if (lStack_48 == 1) {
      return 1;
    }
  }
  else {
    pcStack_58 = (code *)0x180b42;
    connection_fail_cold_1();
LAB_00180b42:
    pcStack_58 = (code *)0x180b4f;
    connection_fail_cold_2();
LAB_00180b4f:
    pcStack_58 = (code *)0x180b54;
    connection_fail_cold_3();
LAB_00180b54:
    pcStack_58 = (code *)0x180b61;
    connection_fail_cold_4();
LAB_00180b61:
    pcStack_58 = (code *)0x180b66;
    connection_fail_cold_5();
LAB_00180b66:
    pcStack_58 = (code *)0x180b73;
    connection_fail_cold_6();
  }
  iVar1 = (int)&lStack_48;
  pcStack_58 = on_connect_with_close;
  connection_fail_cold_7();
  if (*(uv_tcp_t **)((long)plVar4 + 0x50) == &tcp) {
    pcStack_58 = (code *)(long)iVar1;
    uStack_60 = 0xffffffffffffff91;
    if (pcStack_58 != (code *)0xffffffffffffff91) goto LAB_00180bed;
    connect_cb_calls = connect_cb_calls + 1;
    pcStack_58 = (code *)(long)close_cb_calls;
    uStack_60 = 0;
    if (pcStack_58 == (code *)0x0) {
      uv_close((uv_handle_t *)&tcp,on_close);
      return extraout_EAX;
    }
  }
  else {
    p_Stack_70 = (uv_connect_cb)0x180bed;
    on_connect_with_close_cold_1();
LAB_00180bed:
    p_Stack_70 = (uv_connect_cb)0x180bfc;
    on_connect_with_close_cold_2();
  }
  p_Stack_70 = run_test_connection_fail_doesnt_auto_close;
  on_connect_with_close_cold_3();
  iVar3 = (int)&lStack_80;
  p_Stack_70 = cb;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer);
  lStack_78 = (long)iVar1;
  lStack_80 = 0;
  if (lStack_78 == 0) {
    connection_fail(on_connect_without_close);
    lStack_78 = 1;
    lStack_80 = (long)timer_close_cb_calls;
    if (lStack_80 != 1) goto LAB_00180cf4;
    lStack_78 = 1;
    lStack_80 = (long)timer_cb_calls;
    if (lStack_80 == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      lStack_78 = 0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      lStack_80 = (long)iVar1;
      if (lStack_78 == lStack_80) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00180d0e;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_00180cf4:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_00180d0e:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar3 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return 0;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(connection_fail) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  connection_fail(on_connect_with_close);

  ASSERT_OK(timer_close_cb_calls);
  ASSERT_OK(timer_cb_calls);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}